

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O1

EncConfig * __thiscall QPDFJob::EncConfig::extract(EncConfig *this,string *parameter)

{
  int iVar1;
  element_type *peVar2;
  int iVar3;
  
  iVar1 = ((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->keylen;
  iVar3 = std::__cxx11::string::compare((char *)parameter);
  peVar2 = (this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (iVar1 == 0x28) {
    peVar2->r2_extract = iVar3 == 0;
  }
  else {
    peVar2->r3_extract = iVar3 == 0;
  }
  return this;
}

Assistant:

QPDFJob::EncConfig*
QPDFJob::EncConfig::extract(std::string const& parameter)
{
    if (config->o.m->keylen == 40) {
        config->o.m->r2_extract = (parameter == "y");
    } else {
        config->o.m->r3_extract = (parameter == "y");
    }
    return this;
}